

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding.c
# Opt level: O0

void xmlCleanupCharEncodingHandlers(void)

{
  xmlCleanupEncodingAliases();
  if (handlers != (xmlCharEncodingHandlerPtr *)0x0) {
    while (0 < nbCharEncodingHandler) {
      nbCharEncodingHandler = nbCharEncodingHandler + -1;
      if (handlers[nbCharEncodingHandler] != (xmlCharEncodingHandlerPtr)0x0) {
        if (handlers[nbCharEncodingHandler]->name != (char *)0x0) {
          (*xmlFree)(handlers[nbCharEncodingHandler]->name);
        }
        (*xmlFree)(handlers[nbCharEncodingHandler]);
      }
    }
    (*xmlFree)(handlers);
    handlers = (xmlCharEncodingHandlerPtr *)0x0;
    nbCharEncodingHandler = 0;
    xmlDefaultCharEncodingHandler = (xmlCharEncodingHandlerPtr)0x0;
  }
  return;
}

Assistant:

void
xmlCleanupCharEncodingHandlers(void) {
    xmlCleanupEncodingAliases();

    if (handlers == NULL) return;

    for (;nbCharEncodingHandler > 0;) {
        nbCharEncodingHandler--;
	if (handlers[nbCharEncodingHandler] != NULL) {
	    if (handlers[nbCharEncodingHandler]->name != NULL)
		xmlFree(handlers[nbCharEncodingHandler]->name);
	    xmlFree(handlers[nbCharEncodingHandler]);
	}
    }
    xmlFree(handlers);
    handlers = NULL;
    nbCharEncodingHandler = 0;
    xmlDefaultCharEncodingHandler = NULL;
}